

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O2

uint read_pbm_integer(j_compress_ptr cinfo,FILE *infile,uint maxval)

{
  jpeg_error_mgr *pjVar1;
  int iVar2;
  uint uVar3;
  
  do {
    iVar2 = pbm_getc(infile);
    uVar3 = iVar2 + 1;
    if (0x21 < uVar3) goto LAB_0010435f;
  } while ((0x200004c00U >> ((ulong)uVar3 & 0x3f) & 1) != 0);
  if ((ulong)uVar3 == 0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x2b;
    (*pjVar1->error_exit)((j_common_ptr)cinfo);
  }
  else {
LAB_0010435f:
    if (0xfffffff5 < iVar2 - 0x3aU) goto LAB_00104378;
  }
  pjVar1 = cinfo->err;
  pjVar1->msg_code = 0x405;
  (*pjVar1->error_exit)((j_common_ptr)cinfo);
LAB_00104378:
  uVar3 = iVar2 - 0x30;
  while( true ) {
    iVar2 = pbm_getc(infile);
    if (9 < iVar2 - 0x30U) break;
    uVar3 = (iVar2 - 0x30U) + uVar3 * 10;
    if (maxval < uVar3) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 0x407;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
  }
  return uVar3;
}

Assistant:

LOCAL(unsigned int)
read_pbm_integer(j_compress_ptr cinfo, FILE *infile, unsigned int maxval)
/* Read an unsigned decimal integer from the PPM file */
/* Swallows one trailing character after the integer */
/* Note that on a 16-bit-int machine, only values up to 64k can be read. */
/* This should not be a problem in practice. */
{
  register int ch;
  register unsigned int val;

  /* Skip any leading whitespace */
  do {
    ch = pbm_getc(infile);
    if (ch == EOF)
      ERREXIT(cinfo, JERR_INPUT_EOF);
  } while (ch == ' ' || ch == '\t' || ch == '\n' || ch == '\r');

  if (ch < '0' || ch > '9')
    ERREXIT(cinfo, JERR_PPM_NONNUMERIC);

  val = ch - '0';
  while ((ch = pbm_getc(infile)) >= '0' && ch <= '9') {
    val *= 10;
    val += ch - '0';
    if (val > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
  }

  return val;
}